

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_index.cpp
# Opt level: O0

int64_t cornelich::vanilla_index::append(region *region,int64_t index_value)

{
  int32_t iVar1;
  uint8_t *puVar2;
  logic_error *this;
  streamer *this_00;
  bool bVar3;
  int local_200 [4];
  streamer local_1f0;
  undefined1 local_68 [40];
  int32_t position;
  bool eof;
  int64_t index_value_local;
  region *region_local;
  long local_28;
  long local_20;
  int local_14;
  int64_t local_10;
  
  local_68[0x27] = 0;
  _position = index_value;
  index_value_local = (int64_t)region;
  local_68._32_4_ = cornelich::region::position(region);
  do {
    if (((local_68[0x27] ^ 0xff) & 1) == 0) {
      return -1;
    }
    iVar1 = cornelich::region::limit((region *)index_value_local);
    local_68[0x27] = iVar1 - local_68._32_4_ < 8;
    if (!(bool)local_68[0x27]) {
      local_10 = index_value_local;
      local_14 = local_68._32_4_;
      local_20 = 0;
      local_28 = _position;
      puVar2 = cornelich::region::data((region *)index_value_local);
      LOCK();
      bVar3 = local_20 == *(long *)(puVar2 + local_14);
      if (bVar3) {
        *(long *)(puVar2 + local_14) = local_28;
      }
      UNLOCK();
      if (bVar3) {
        bVar3 = cornelich::region::position((region *)index_value_local,local_68._32_4_ + 8);
        if (((bVar3 ^ 0xffU) & 1) == 0) {
          return (long)(int)local_68._32_4_;
        }
        this = (logic_error *)__cxa_allocate_exception(0x10);
        util::streamer::streamer(&local_1f0);
        this_00 = util::streamer::operator<<(&local_1f0,(char (*) [25])"Position out of bounds: ");
        local_200[0] = local_68._32_4_ + 8;
        util::streamer::operator<<(this_00,local_200);
        util::streamer::operator_cast_to_string((streamer *)local_68);
        std::logic_error::logic_error(this,(string *)local_68);
        __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
    local_68._32_4_ = local_68._32_4_ + 8;
  } while( true );
}

Assistant:

std::int64_t vanilla_index::append(region & region, std::int64_t index_value)
{
    // Initial values in the index are zero.
    // Try to CAS64 against the 'current' tail of the index.
    // If no other thread was 'faster' then we succeed, otherwise we'll try again

    bool eof = false;
    auto position = region.position();
    while (!eof)
    {
        eof = (region.limit() - position) < 8;
        if (!eof && region.cas64(position, 0L, index_value))
        {
            if(BOOST_UNLIKELY(!region.position(position + 8)))
            {
                throw std::logic_error(util::streamer() << "Position out of bounds: " << position + 8);
            }

            return position;
        }
        position += 8;
    }

    return -1;
}